

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall
ON_MeshFace::IsPlanar
          (ON_MeshFace *this,double planar_tolerance,double angle_tolerance_radians,
          ON_3dPointListRef *vertex_list,ON_PlaneEquation *face_plane_equation)

{
  double *pdVar1;
  bool bVar2;
  ON_3dPoint P;
  bool bVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_PlaneEquation e;
  ON_3dVector corner_normals [4];
  double local_f0;
  ON_3dPoint local_d0;
  ON_PlaneEquation local_b8;
  ON_3dVector local_98 [2];
  ON_3dVector local_68 [2];
  
  ON_PlaneEquation::ON_PlaneEquation(&local_b8);
  bVar3 = GetPlaneEquation(this,vertex_list,&local_b8);
  dVar6 = ON_PlaneEquation::UnsetPlaneEquation.d;
  dVar5 = ON_PlaneEquation::UnsetPlaneEquation.y;
  dVar7 = ON_PlaneEquation::UnsetPlaneEquation.x;
  if (bVar3) {
    if (face_plane_equation != (ON_PlaneEquation *)0x0) {
      face_plane_equation->z = local_b8.z;
      face_plane_equation->d = local_b8.d;
      face_plane_equation->x = local_b8.x;
      face_plane_equation->y = local_b8.y;
    }
    bVar3 = true;
    if (this->vi[2] != this->vi[3]) {
      dVar7 = 0.0;
      local_f0 = 0.0;
      if (0.0 <= planar_tolerance) {
        for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
          if (this->vi[lVar4] != this->vi[lVar4 + 1]) {
            ON_3dPointListRef::operator[](&local_d0,vertex_list,this->vi[lVar4 + 1]);
            P.y = local_d0.y;
            P.x = local_d0.x;
            P.z = local_d0.z;
            dVar6 = ON_PlaneEquation::ValueAt(&local_b8,P);
            dVar5 = local_f0;
            if (((dVar6 < dVar7) || (bVar2 = local_f0 < dVar6, dVar5 = dVar6, dVar6 = dVar7, bVar2))
               && (dVar7 = dVar6, local_f0 = dVar5, planar_tolerance < dVar5 - dVar6))
            goto LAB_0051a49a;
          }
        }
      }
      if (0.0 <= angle_tolerance_radians) {
        GetCornerNormals(this,vertex_list,local_98);
        dVar7 = ON_3dVector::UnsetVector.x;
        if (3.141592653589793 <= angle_tolerance_radians) {
          dVar5 = -1.0;
        }
        else {
          dVar5 = cos(angle_tolerance_radians);
        }
        for (lVar4 = 0; lVar4 != 0x30; lVar4 = lVar4 + 0x18) {
          pdVar1 = (double *)((long)&local_98[0].x + lVar4);
          if ((dVar7 != *pdVar1) || (NAN(dVar7) || NAN(*pdVar1))) {
            pdVar1 = (double *)((long)&local_68[0].x + lVar4);
            if (((dVar7 != *pdVar1) || (NAN(dVar7) || NAN(*pdVar1))) &&
               (dVar6 = ON_3dVector::operator*
                                  ((ON_3dVector *)((long)&local_98[0].x + lVar4),
                                   (ON_3dVector *)((long)&local_68[0].x + lVar4)), dVar6 < dVar5))
            goto LAB_0051a49a;
          }
        }
      }
    }
  }
  else {
    if (face_plane_equation != (ON_PlaneEquation *)0x0) {
      face_plane_equation->z = ON_PlaneEquation::UnsetPlaneEquation.z;
      face_plane_equation->d = dVar6;
      face_plane_equation->x = dVar7;
      face_plane_equation->y = dVar5;
    }
LAB_0051a49a:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_MeshFace::IsPlanar( 
  double planar_tolerance,
  double angle_tolerance_radians,
  const class ON_3dPointListRef& vertex_list, 
  ON_PlaneEquation* face_plane_equation
  ) const
{
  ON_PlaneEquation e;

  for (;;)
  {
    if (!GetPlaneEquation(vertex_list, e))
      break;

    if ( face_plane_equation )
      *face_plane_equation = e;

    if (vi[2] == vi[3])
      return true; // triangle

    if (planar_tolerance >= 0.0)
    {
      double h0, h1, h;
      h0 = h1 = 0.0;
      for (int i = 1; i < 3; i++)
      {
        if (vi[i - 1] == vi[i])
          continue;
        h = e.ValueAt(vertex_list[vi[i]]);
        if (h < h0)
          h0 = h;
        else if (h > h1)
          h1 = h;
        else
          continue;
        if (h1 - h0 > planar_tolerance)
        {
          return false;
        }
      }
    }

    if (angle_tolerance_radians >= 0.0)
    {
      ON_3dVector corner_normals[4];
      GetCornerNormals(vertex_list, corner_normals);
      const double unset_x = ON_3dVector::UnsetVector.x;
      const double cos_atol = (angle_tolerance_radians < ON_PI) ? cos(angle_tolerance_radians) : -1.0;
      for (unsigned int i = 0; i < 2; i++)
      {
        if (unset_x != corner_normals[i].x && unset_x != corner_normals[i+2].x && corner_normals[i] * corner_normals[i+2] < cos_atol)
          return false;
      }
    }

    return true;
  }

  if (face_plane_equation)
    *face_plane_equation = ON_PlaneEquation::UnsetPlaneEquation;

  return false;
}